

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O0

UChar * icu_63::PatternProps::skipWhiteSpace(UChar *s,int32_t length)

{
  UBool UVar1;
  bool bVar2;
  int local_14;
  UChar *pUStack_10;
  int32_t length_local;
  UChar *s_local;
  
  local_14 = length;
  pUStack_10 = s;
  while( true ) {
    bVar2 = false;
    if (0 < local_14) {
      UVar1 = isWhiteSpace((uint)(ushort)*pUStack_10);
      bVar2 = UVar1 != '\0';
    }
    if (!bVar2) break;
    pUStack_10 = pUStack_10 + 1;
    local_14 = local_14 + -1;
  }
  return pUStack_10;
}

Assistant:

const UChar *
PatternProps::skipWhiteSpace(const UChar *s, int32_t length) {
    while(length>0 && isWhiteSpace(*s)) {
        ++s;
        --length;
    }
    return s;
}